

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O0

void __thiscall ProStringList::ProStringList(ProStringList *this,QStringList *list)

{
  bool bVar1;
  const_iterator o;
  ProString *this_00;
  QList<QString> *in_RSI;
  ProString *in_RDI;
  long in_FS_OFFSET;
  QString *str;
  QStringList *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QString> *in_stack_ffffffffffffff90;
  QList<ProString> *in_stack_ffffffffffffffb8;
  const_iterator local_10;
  qsizetype asize;
  
  asize = *(qsizetype *)(in_FS_OFFSET + 0x28);
  QList<ProString>::QList((QList<ProString> *)0x112d4e);
  QList<QString>::size(in_RSI);
  QList<ProString>::reserve(in_stack_ffffffffffffffb8,asize);
  local_10.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<QString>::begin(in_stack_ffffffffffffff90);
  o = QList<QString>::end(in_stack_ffffffffffffff90);
  while( true ) {
    bVar1 = QList<QString>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    this_00 = (ProString *)QList<QString>::const_iterator::operator*(&local_10);
    ProString::ProString(this_00,&in_RDI->m_string);
    operator<<((ProStringList *)this_00,in_RDI);
    ProString::~ProString((ProString *)0x112e17);
    QList<QString>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == asize) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList::ProStringList(const QStringList &list)
{
    reserve(list.size());
    for (const QString &str : list)
        *this << ProString(str);
}